

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

distribute_container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
mxx::impl::
distribute_container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::stable_distribute(distribute_container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c,
                   comm *comm)

{
  int iVar1;
  int rank;
  unsigned_long n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  undefined1 local_60 [8];
  block_decomposition<unsigned_long> part;
  size_t total_size;
  size_t local_size;
  comm *local_20;
  comm *comm_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  
  local_20 = comm;
  comm_local = (comm *)c;
  c_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  iVar1 = mxx::comm::size(comm);
  if (iVar1 == 1) {
    std::__cxx11::string::string((string *)this,(string *)comm_local);
  }
  else {
    local_size._7_1_ = 0;
    std::__cxx11::string::string((string *)this);
    total_size = std::__cxx11::string::size();
    n = allreduce<unsigned_long>(&total_size,local_20);
    iVar1 = mxx::comm::size(local_20);
    rank = mxx::comm::rank(local_20);
    partition::block_decomposition<unsigned_long>::block_decomposition
              ((block_decomposition<unsigned_long> *)local_60,n,iVar1,rank);
    partition::block_decomposition<unsigned_long>::local_size
              ((block_decomposition<unsigned_long> *)local_60);
    std::__cxx11::string::resize((ulong)this);
    begin._M_current = (char *)std::__cxx11::string::begin();
    end._M_current = (char *)std::__cxx11::string::end();
    out._M_current = (char *)std::__cxx11::string::begin();
    stable_distribute<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (begin,end,out,local_20);
    local_size._7_1_ = 1;
    partition::block_decomposition<unsigned_long>::~block_decomposition
              ((block_decomposition<unsigned_long> *)local_60);
    if ((local_size._7_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)this);
    }
  }
  return this;
}

Assistant:

inline static Container stable_distribute(const Container& c, const mxx::comm& comm) {
        if (comm.size() == 1)
            return c;
        Container result;
        size_t local_size = c.size();
        // TODO: this allreduce is duplicated in the `stable_distribute` function
        //       which could be avoided
        size_t total_size = mxx::allreduce(local_size, comm);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        result.resize(part.local_size());

        // call the iterator based implementation
        ::mxx::stable_distribute(c.begin(), c.end(), result.begin(), comm);

        // return the container
        return result;
    }